

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

bool __thiscall
stackjit::ExecutionEngine::loadAssembly
          (ExecutionEngine *this,string *filePath,AssemblyType assemblyType)

{
  byte bVar1;
  long lVar2;
  ostream *poVar3;
  char *local_300;
  allocator local_2b1;
  string local_2b0 [32];
  undefined1 local_290 [8];
  Assembly assembly;
  ifstream local_230 [8];
  ifstream fileStream;
  _Ios_Openmode local_28;
  openmode openMode;
  AssemblyType assemblyType_local;
  string *filePath_local;
  ExecutionEngine *this_local;
  
  local_28 = _S_in;
  lVar2 = std::__cxx11::string::find((char *)filePath,0x25db3f);
  if (lVar2 != -1) {
    local_28 = _S_bin;
  }
  std::ifstream::ifstream(local_230,(string *)filePath,local_28);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Could not load the assembly \'");
    poVar3 = std::operator<<(poVar3,(string *)filePath);
    poVar3 = std::operator<<(poVar3,"\'.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    if (local_28 == _S_bin) {
      loadImage(this,local_230,assemblyType);
    }
    else {
      if (assemblyType == Program) {
        local_300 = "program";
      }
      else {
        local_300 = "library";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,local_300,&local_2b1);
      Loader::Assembly::Assembly((Assembly *)local_290,(string *)local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      Loader::load((istream *)local_230,(Assembly *)local_290);
      loadAssembly(this,(Assembly *)local_290,assemblyType);
      Loader::Assembly::~Assembly((Assembly *)local_290);
    }
    this_local._7_1_ = true;
  }
  assembly.mClasses.
  super__Vector_base<stackjit::Loader::Class,_std::allocator<stackjit::Loader::Class>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::ifstream::~ifstream(local_230);
  return this_local._7_1_;
}

Assistant:

bool ExecutionEngine::loadAssembly(std::string filePath, AssemblyType assemblyType) {
		std::ios::openmode openMode = std::ios::in;

		if (filePath.find(".simg") != std::string::npos) {
			openMode = std::ios::binary;
		}

		std::ifstream fileStream(filePath, openMode);

		if (!fileStream.is_open()) {
			std::cout << "Could not load the assembly '" << filePath << "'." << std::endl;
			return false;
		}

		if (openMode == std::ios::binary) {
			loadImage(fileStream, assemblyType);
		} else {
			Loader::Assembly assembly(assemblyType == AssemblyType::Program ? "program": "library");
			Loader::load(fileStream, assembly);
			loadAssembly(assembly, assemblyType);
		}

		return true;
	}